

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

void dg::pta::PointerAnalysisFSInv::replaceTargetWithInv(PointsToSetT *S1,PSNode *target)

{
  bool bVar1;
  PSNode *in_RSI;
  Pointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  PointsToSetT *__range2;
  PointsToSetT S;
  const_iterator *in_stack_ffffffffffffff58;
  PointerIdPointsToSet *rhs;
  Offset in_stack_ffffffffffffff60;
  PSNode *local_98;
  Offset target_00;
  __node_base in_stack_ffffffffffffff78;
  Offset in_stack_ffffffffffffff80;
  PointerIdPointsToSet *in_stack_ffffffffffffff88;
  
  PointerIdPointsToSet::PointerIdPointsToSet((PointerIdPointsToSet *)0x17f4f1);
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_ffffffffffffff60.offset);
  PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_ffffffffffffff60.offset);
  while( true ) {
    bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffff60.offset,in_stack_ffffffffffffff58)
    ;
    if (!bVar1) break;
    _local_98 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff78._M_nxt = (_Hash_node_base *)&local_98;
    if (local_98 != in_RSI) {
      PointerIdPointsToSet::add
                (in_stack_ffffffffffffff88,(Pointer *)in_stack_ffffffffffffff80.offset);
    }
    PointerIdPointsToSet::const_iterator::operator++((const_iterator *)target_00.offset);
  }
  rhs = INVALIDATED;
  Offset::Offset((Offset *)&stack0xffffffffffffff60,0);
  PointerIdPointsToSet::add
            ((PointerIdPointsToSet *)in_stack_ffffffffffffff78._M_nxt,(PSNode *)target_00.offset,
             in_stack_ffffffffffffff80);
  PointerIdPointsToSet::swap((PointerIdPointsToSet *)in_stack_ffffffffffffff60.offset,rhs);
  PointerIdPointsToSet::~PointerIdPointsToSet((PointerIdPointsToSet *)0x17f5c9);
  return;
}

Assistant:

static void replaceTargetWithInv(PointsToSetT &S1, PSNode *target) {
        PointsToSetT S;
        for (const auto &ptr : S1) {
            if (ptr.target != target)
                S.add(ptr);
        }

        S.add(INVALIDATED, 0);
        S1.swap(S);
    }